

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_62ef3::OpenXrProgram::InitializeSystem(OpenXrProgram *this)

{
  XrFormFactor XVar1;
  XrResult res;
  char *pcVar2;
  XrSystemGetInfo systemInfo;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  ulong local_28;
  
  if (this->m_instance == (XrInstance)0x0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Check failed","");
    Throw(&local_58,"m_instance != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:296"
         );
  }
  if (this->m_systemId != 0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Check failed","");
    Throw(&local_78,"m_systemId == XR_NULL_SYSTEM_ID",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:297"
         );
  }
  local_38 = 4;
  uStack_34 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  local_28 = (ulong)(((this->m_options).
                      super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Parsed)
                    .FormFactor;
  res = xrGetSystem(this->m_instance,&local_38,&this->m_systemId);
  if (res < XR_SUCCESS) {
    ThrowXrResult(res,"xrGetSystem(m_instance, &systemInfo, &m_systemId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:301"
                 );
  }
  XVar1 = (((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->Parsed).FormFactor;
  if (XVar1 == XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY) {
    pcVar2 = "XR_FORM_FACTOR_HEAD_MOUNTED_DISPLAY";
  }
  else if (XVar1 == XR_FORM_FACTOR_MAX_ENUM) {
    pcVar2 = "XR_FORM_FACTOR_MAX_ENUM";
  }
  else if (XVar1 == XR_FORM_FACTOR_HANDHELD_DISPLAY) {
    pcVar2 = "XR_FORM_FACTOR_HANDHELD_DISPLAY";
  }
  else {
    pcVar2 = "Unknown XrFormFactor";
  }
  Fmt_abi_cxx11_(&local_98,"Using system %d for form factor %s",this->m_systemId,pcVar2);
  Log::Write(Verbose,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (this->m_instance != (XrInstance)0x0) {
    if (this->m_systemId != 0) {
      return;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Check failed","");
    Throw(&local_d8,"m_systemId != XR_NULL_SYSTEM_ID",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:306"
         );
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Check failed","");
  Throw(&local_b8,"m_instance != XR_NULL_HANDLE",
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:305"
       );
}

Assistant:

void InitializeSystem() override {
        CHECK(m_instance != XR_NULL_HANDLE);
        CHECK(m_systemId == XR_NULL_SYSTEM_ID);

        XrSystemGetInfo systemInfo{XR_TYPE_SYSTEM_GET_INFO};
        systemInfo.formFactor = m_options->Parsed.FormFactor;
        CHECK_XRCMD(xrGetSystem(m_instance, &systemInfo, &m_systemId));

        Log::Write(Log::Level::Verbose,
                   Fmt("Using system %d for form factor %s", m_systemId, to_string(m_options->Parsed.FormFactor)));
        CHECK(m_instance != XR_NULL_HANDLE);
        CHECK(m_systemId != XR_NULL_SYSTEM_ID);
    }